

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_GetGlyphBox(nk_tt_fontinfo *info,int glyph_index,int *x0,int *y0,int *x1,int *y1)

{
  nk_short nVar1;
  int iVar2;
  int g;
  int *y1_local;
  int *x1_local;
  int *y0_local;
  int *x0_local;
  int glyph_index_local;
  nk_tt_fontinfo *info_local;
  
  iVar2 = nk_tt__GetGlyfOffset(info,glyph_index);
  if (iVar2 < 0) {
    info_local._4_4_ = 0;
  }
  else {
    if (x0 != (int *)0x0) {
      nVar1 = nk_ttSHORT(info->data + (long)iVar2 + 2);
      *x0 = (int)nVar1;
    }
    if (y0 != (int *)0x0) {
      nVar1 = nk_ttSHORT(info->data + (long)iVar2 + 4);
      *y0 = (int)nVar1;
    }
    if (x1 != (int *)0x0) {
      nVar1 = nk_ttSHORT(info->data + (long)iVar2 + 6);
      *x1 = (int)nVar1;
    }
    if (y1 != (int *)0x0) {
      nVar1 = nk_ttSHORT(info->data + (long)iVar2 + 8);
      *y1 = (int)nVar1;
    }
    info_local._4_4_ = 1;
  }
  return info_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt_GetGlyphBox(const struct nk_tt_fontinfo *info, int glyph_index,
    int *x0, int *y0, int *x1, int *y1)
{
    int g = nk_tt__GetGlyfOffset(info, glyph_index);
    if (g < 0) return 0;

    if (x0) *x0 = nk_ttSHORT(info->data + g + 2);
    if (y0) *y0 = nk_ttSHORT(info->data + g + 4);
    if (x1) *x1 = nk_ttSHORT(info->data + g + 6);
    if (y1) *y1 = nk_ttSHORT(info->data + g + 8);
    return 1;
}